

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O1

void ELFIO::dump::dynamic_tags(ostream *out,elfio *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  elfio *peVar2;
  elf_header *peVar3;
  char cVar4;
  Elf_Xword EVar5;
  Elf_Xword value_00;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer puVar10;
  pointer puVar11;
  bool bVar12;
  string str;
  Elf_Xword tag;
  Elf_Xword value;
  dynamic_section_accessor dynamic;
  string local_98;
  Elf_Xword local_78;
  elfio *local_70;
  Elf_Xword local_68;
  pointer local_60;
  pointer local_58;
  Elf_Xword local_50;
  dynamic_section_accessor_template<ELFIO::section> local_48;
  
  peVar2 = (reader->sections).parent;
  puVar10 = (peVar2->sections_).
            super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (peVar2->sections_).
            super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar11) {
    paVar1 = &local_98.field_2;
    local_70 = reader;
    local_60 = puVar11;
    do {
      iVar6 = (*((puVar10->_M_t).
                 super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                 super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                 super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[5])();
      if (iVar6 == 6) {
        local_48.dynamic_section =
             (puVar10->_M_t).
             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
             super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl;
        local_48.elf_file = local_70;
        local_48.entries_num = 0;
        local_50 = dynamic_section_accessor_template<ELFIO::section>::get_entries_num(&local_48);
        if (local_50 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"Dynamic section (",0x11);
          (*((puVar10->_M_t).
             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
             super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[3])
                    (&local_98);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_98._M_dataplus._M_p,local_98._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          local_58 = puVar10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,"[  Nr ] Tag              Name/Value",0x23);
          cVar4 = (char)out;
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          uVar9 = 1;
          do {
            local_78 = 0;
            local_68 = 0;
            local_98._M_string_length = 0;
            local_98.field_2._M_local_buf[0] = '\0';
            local_98._M_dataplus._M_p = (pointer)paVar1;
            dynamic_section_accessor_template<ELFIO::section>::get_entry
                      (&local_48,uVar9 - 1,&local_78,&local_68,&local_98);
            value_00 = local_68;
            EVar5 = local_78;
            peVar3 = (local_70->header)._M_t.
                     super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                     .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
            if (peVar3 == (elf_header *)0x0) {
              uVar7 = 0;
            }
            else {
              uVar7 = (*peVar3->_vptr_elf_header[4])();
            }
            dynamic_tag(out,uVar9 - 1,EVar5,value_00,&local_98,uVar7 & 0xff);
            EVar5 = local_78;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar1) {
              operator_delete(local_98._M_dataplus._M_p,
                              CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                       local_98.field_2._M_local_buf[0]) + 1);
            }
          } while ((EVar5 != 0) && (bVar12 = uVar9 < local_50, uVar9 = uVar9 + 1, bVar12));
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          puVar10 = local_58;
          puVar11 = local_60;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar11);
  }
  return;
}

Assistant:

static void dynamic_tags( std::ostream& out, const elfio& reader )
    {
        for ( const auto& sec : reader.sections ) { // For all sections
            if ( SHT_DYNAMIC == sec->get_type() ) {
                dynamic_section_accessor dynamic( reader, sec.get() );

                Elf_Xword dyn_no = dynamic.get_entries_num();
                if ( dyn_no == 0 )
                    continue;

                out << "Dynamic section (" << sec->get_name() << ")"
                    << std::endl;
                out << "[  Nr ] Tag              Name/Value" << std::endl;
                for ( Elf_Xword i = 0; i < dyn_no; ++i ) {
                    Elf_Xword   tag   = 0;
                    Elf_Xword   value = 0;
                    std::string str;
                    dynamic.get_entry( i, tag, value, str );
                    dynamic_tag( out, i, tag, value, str, reader.get_class() );
                    if ( DT_NULL == tag ) {
                        break;
                    }
                }

                out << std::endl;
            }
        }
    }